

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_voice.c
# Opt level: O0

_Bool al_set_voice_position(ALLEGRO_VOICE *voice,uint val)

{
  int iVar1;
  undefined4 in_ESI;
  long in_RDI;
  _Bool ret;
  undefined1 local_1;
  
  if ((*(long *)(in_RDI + 0x20) == 0) || ((*(byte *)(in_RDI + 0x28) & 1) != 0)) {
    local_1 = false;
  }
  else {
    al_lock_mutex(*(undefined8 *)(in_RDI + 0x30));
    iVar1 = (**(code **)(*(long *)(in_RDI + 0x48) + 0x58))(in_RDI,in_ESI);
    local_1 = iVar1 == 0;
    al_unlock_mutex(*(undefined8 *)(in_RDI + 0x30));
  }
  return local_1;
}

Assistant:

bool al_set_voice_position(ALLEGRO_VOICE *voice, unsigned int val)
{
   ASSERT(voice);

   if (voice->attached_stream && !voice->is_streaming) {
      bool ret;
      al_lock_mutex(voice->mutex);
      // XXX change method
      ret = voice->driver->set_voice_position(voice, val) == 0;
      al_unlock_mutex(voice->mutex);
      return ret;
   }

   return false;
}